

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

block_state deflate_slow(deflate_state *s,int flush)

{
  ushort uVar1;
  uInt uVar2;
  uInt uVar3;
  uInt uVar4;
  Posf *pPVar5;
  ulong uVar6;
  uInt uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  Bytef *pBVar13;
  uint uVar14;
  uInt uVar15;
  bool bVar16;
  
  do {
    if (s->lookahead < 0x106) {
      fill_window(s);
      uVar12 = s->lookahead;
      if (flush == 0 && uVar12 < 0x106) {
        return need_more;
      }
      if (uVar12 == 0) {
        if (s->match_available != 0) {
          bVar11 = s->window[s->strstart - 1];
          uVar12 = s->sym_next;
          s->sym_next = uVar12 + 1;
          s->sym_buf[uVar12] = '\0';
          uVar12 = s->sym_next;
          s->sym_next = uVar12 + 1;
          s->sym_buf[uVar12] = '\0';
          uVar12 = s->sym_next;
          s->sym_next = uVar12 + 1;
          s->sym_buf[uVar12] = bVar11;
          s->dyn_ltree[bVar11].fc.freq = s->dyn_ltree[bVar11].fc.freq + 1;
          s->match_available = 0;
        }
        uVar12 = s->strstart;
        uVar10 = 2;
        if (uVar12 < 2) {
          uVar10 = uVar12;
        }
        s->insert = uVar10;
        if (flush == 4) {
          uVar6 = s->block_start;
          if ((long)uVar6 < 0) {
            pBVar13 = (Bytef *)0x0;
          }
          else {
            pBVar13 = s->window + (uVar6 & 0xffffffff);
          }
          _tr_flush_block(s,(charf *)pBVar13,uVar12 - uVar6,1);
          s->block_start = (ulong)s->strstart;
          flush_pending(s->strm);
          return finish_done - (s->strm->avail_out == 0);
        }
        if (s->sym_next != 0) {
          uVar6 = s->block_start;
          if ((long)uVar6 < 0) {
            pBVar13 = (Bytef *)0x0;
          }
          else {
            pBVar13 = s->window + (uVar6 & 0xffffffff);
          }
          _tr_flush_block(s,(charf *)pBVar13,uVar12 - uVar6,0);
          s->block_start = (ulong)s->strstart;
          flush_pending(s->strm);
          if (s->strm->avail_out == 0) {
            return need_more;
          }
        }
        return block_done;
      }
      uVar10 = s->match_length;
      uVar7 = s->match_start;
      if (2 < uVar12) goto LAB_00154a65;
      s->prev_length = uVar10;
      s->prev_match = uVar7;
      s->match_length = 2;
LAB_00154b15:
      uVar8 = 2;
    }
    else {
      uVar10 = s->match_length;
      uVar7 = s->match_start;
LAB_00154a65:
      uVar12 = s->strstart;
      uVar14 = ((uint)s->window[uVar12 + 2] ^ s->ins_h << ((byte)s->hash_shift & 0x1f)) &
               s->hash_mask;
      s->ins_h = uVar14;
      pPVar5 = s->head;
      uVar1 = pPVar5[uVar14];
      s->prev[s->w_mask & uVar12] = uVar1;
      pPVar5[uVar14] = (Posf)uVar12;
      s->prev_length = uVar10;
      s->prev_match = uVar7;
      s->match_length = 2;
      uVar14 = (uint)uVar1;
      if (uVar14 == 0) goto LAB_00154b15;
      uVar8 = 2;
      if ((uVar10 < s->max_lazy_match) && (uVar12 - uVar14 <= s->w_size - 0x106)) {
        uVar8 = longest_match(s,uVar14);
        s->match_length = uVar8;
        if ((uVar8 < 6) &&
           ((s->strategy == 1 ||
            ((uVar8 == 3 && (uVar8 = 3, 0x1000 < s->strstart - s->match_start)))))) {
          s->match_length = 2;
          uVar8 = 2;
        }
      }
      uVar10 = s->prev_length;
    }
    if ((uVar10 < 3) || (uVar10 < uVar8)) {
      if (s->match_available == 0) {
        s->match_available = 1;
        s->strstart = s->strstart + 1;
        s->lookahead = s->lookahead - 1;
      }
      else {
        bVar11 = s->window[s->strstart - 1];
        uVar12 = s->sym_next;
        s->sym_next = uVar12 + 1;
        s->sym_buf[uVar12] = '\0';
        uVar12 = s->sym_next;
        s->sym_next = uVar12 + 1;
        s->sym_buf[uVar12] = '\0';
        uVar12 = s->sym_next;
        s->sym_next = uVar12 + 1;
        s->sym_buf[uVar12] = bVar11;
        s->dyn_ltree[bVar11].fc.freq = s->dyn_ltree[bVar11].fc.freq + 1;
        if (s->sym_next == s->sym_end) {
          uVar6 = s->block_start;
          if ((long)uVar6 < 0) {
            pBVar13 = (Bytef *)0x0;
          }
          else {
            pBVar13 = s->window + (uVar6 & 0xffffffff);
          }
          _tr_flush_block(s,(charf *)pBVar13,s->strstart - uVar6,0);
          s->block_start = (ulong)s->strstart;
          flush_pending(s->strm);
        }
        s->strstart = s->strstart + 1;
        s->lookahead = s->lookahead - 1;
        if (s->strm->avail_out == 0) {
          return need_more;
        }
      }
    }
    else {
      uVar7 = s->strstart;
      uVar2 = s->lookahead;
      bVar11 = (char)uVar10 - 3;
      uVar14 = (uVar7 + ~s->prev_match) - 1;
      iVar9 = uVar7 + ~s->prev_match;
      uVar12 = s->sym_next;
      s->sym_next = uVar12 + 1;
      s->sym_buf[uVar12] = (uchf)iVar9;
      uVar12 = s->sym_next;
      s->sym_next = uVar12 + 1;
      s->sym_buf[uVar12] = (uchf)((uint)iVar9 >> 8);
      uVar12 = s->sym_next;
      s->sym_next = uVar12 + 1;
      s->sym_buf[uVar12] = bVar11;
      s->dyn_ltree[(ulong)""[bVar11] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[bVar11] + 0x101].fc.freq + 1;
      uVar10 = uVar14 & 0xffff;
      uVar12 = (uVar10 >> 7) + 0x100;
      if (uVar10 < 0x100) {
        uVar12 = uVar14;
      }
      s->dyn_dtree[""[uVar12 & 0xffff]].fc.freq = s->dyn_dtree[""[uVar12 & 0xffff]].fc.freq + 1;
      uVar3 = s->sym_next;
      uVar4 = s->sym_end;
      uVar15 = s->prev_length;
      s->lookahead = (s->lookahead - uVar15) + 1;
      s->prev_length = uVar15 - 2;
      uVar15 = uVar15 - 3;
      uVar12 = s->strstart + 1;
      do {
        s->strstart = uVar12;
        if (uVar12 <= (uVar2 + uVar7) - 3) {
          uVar10 = ((uint)s->window[uVar12 + 2] ^ s->ins_h << ((byte)s->hash_shift & 0x1f)) &
                   s->hash_mask;
          s->ins_h = uVar10;
          pPVar5 = s->head;
          s->prev[s->w_mask & uVar12] = pPVar5[uVar10];
          pPVar5[uVar10] = (Posf)uVar12;
        }
        s->prev_length = uVar15;
        uVar12 = uVar12 + 1;
        bVar16 = uVar15 != 0;
        uVar15 = uVar15 - 1;
      } while (bVar16);
      s->match_available = 0;
      s->match_length = 2;
      s->strstart = uVar12;
      if (uVar3 == uVar4) {
        uVar6 = s->block_start;
        if ((long)uVar6 < 0) {
          pBVar13 = (Bytef *)0x0;
        }
        else {
          pBVar13 = s->window + (uVar6 & 0xffffffff);
        }
        _tr_flush_block(s,(charf *)pBVar13,uVar12 - uVar6,0);
        s->block_start = (ulong)s->strstart;
        flush_pending(s->strm);
        if (s->strm->avail_out == 0) {
          return need_more;
        }
      }
    }
  } while( true );
}

Assistant:

local block_state deflate_slow(deflate_state *s, int flush) {
    IPos hash_head;          /* head of hash chain */
    int bflush;              /* set if current block must be flushed */

    /* Process the input block. */
    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            fill_window(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart + 2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        hash_head = NIL;
        if (s->lookahead >= MIN_MATCH) {
            INSERT_STRING(s, s->strstart, hash_head);
        }

        /* Find the longest match, discarding those <= prev_length.
         */
        s->prev_length = s->match_length, s->prev_match = s->match_start;
        s->match_length = MIN_MATCH-1;

        if (hash_head != NIL && s->prev_length < s->max_lazy_match &&
            s->strstart - hash_head <= MAX_DIST(s)) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
            s->match_length = longest_match (s, hash_head);
            /* longest_match() sets match_start */

            if (s->match_length <= 5 && (s->strategy == Z_FILTERED
#if TOO_FAR <= 32767
                || (s->match_length == MIN_MATCH &&
                    s->strstart - s->match_start > TOO_FAR)
#endif
                )) {

                /* If prev_match is also MIN_MATCH, match_start is garbage
                 * but we will ignore the current match anyway.
                 */
                s->match_length = MIN_MATCH-1;
            }
        }
        /* If there was a match at the previous step and the current
         * match is not better, output the previous match:
         */
        if (s->prev_length >= MIN_MATCH && s->match_length <= s->prev_length) {
            uInt max_insert = s->strstart + s->lookahead - MIN_MATCH;
            /* Do not insert strings in hash table beyond this. */

            check_match(s, s->strstart - 1, s->prev_match, s->prev_length);

            _tr_tally_dist(s, s->strstart - 1 - s->prev_match,
                           s->prev_length - MIN_MATCH, bflush);

            /* Insert in hash table all strings up to the end of the match.
             * strstart - 1 and strstart are already inserted. If there is not
             * enough lookahead, the last two strings are not inserted in
             * the hash table.
             */
            s->lookahead -= s->prev_length - 1;
            s->prev_length -= 2;
            do {
                if (++s->strstart <= max_insert) {
                    INSERT_STRING(s, s->strstart, hash_head);
                }
            } while (--s->prev_length != 0);
            s->match_available = 0;
            s->match_length = MIN_MATCH-1;
            s->strstart++;

            if (bflush) FLUSH_BLOCK(s, 0);

        } else if (s->match_available) {
            /* If there was no match at the previous position, output a
             * single literal. If there was a match but the current match
             * is longer, truncate the previous match to a single literal.
             */
            Tracevv((stderr,"%c", s->window[s->strstart - 1]));
            _tr_tally_lit(s, s->window[s->strstart - 1], bflush);
            if (bflush) {
                FLUSH_BLOCK_ONLY(s, 0);
            }
            s->strstart++;
            s->lookahead--;
            if (s->strm->avail_out == 0) return need_more;
        } else {
            /* There is no previous match to compare with, wait for
             * the next step to decide.
             */
            s->match_available = 1;
            s->strstart++;
            s->lookahead--;
        }
    }
    Assert (flush != Z_NO_FLUSH, "no flush?");
    if (s->match_available) {
        Tracevv((stderr,"%c", s->window[s->strstart - 1]));
        _tr_tally_lit(s, s->window[s->strstart - 1], bflush);
        s->match_available = 0;
    }
    s->insert = s->strstart < MIN_MATCH-1 ? s->strstart : MIN_MATCH-1;
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (s->sym_next)
        FLUSH_BLOCK(s, 0);
    return block_done;
}